

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O0

bool __thiscall ProcessProgress::process_shutdown(ProcessProgress *this,int wstatus)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  pid_t wait_pid;
  int wstatus_local;
  ProcessProgress *this_local;
  
  do {
    bVar3 = process_once(this);
  } while (bVar3);
  std::__cxx11::string::clear();
  this->heartbeats = -1;
  close_and_remove_epoll_entry(&this->crash_fd);
  close_and_remove_epoll_entry(&this->timer_fd);
  close_and_remove_epoll_entry(&this->watchdog_timer_fd);
  Global::active_processes = Global::active_processes + -1;
  uVar1 = this->pid;
  this->pid = -1;
  if (((wstatus & 0x7fU) == 0) && ((int)(wstatus & 0xff00U) >> 8 == 0)) {
    this_local._7_1_ = false;
  }
  else {
    bVar2 = (byte)wstatus;
    if (((char)((bVar2 & 0x7f) + 1) >> 1 < '\x01') ||
       (((wstatus & 0x7fU) != 9 || ((this->expect_kill & 1U) == 0)))) {
      if (('\0' < (char)((bVar2 & 0x7f) + 1) >> 1) && ((wstatus & 0x7fU) == 9)) {
        fprintf(_stderr,
                "Fossilize ERROR: Process index %u (PID: %d) failed and it had to be killed in timeout with SIGKILL.\n"
                ,(ulong)this->index,(ulong)uVar1);
        fflush(_stderr);
      }
      if (((((wstatus & 0x7fU) == 0) || ((char)((bVar2 & 0x7f) + 1) >> 1 < '\x01')) ||
          ((wstatus & 0x7fU) == 9)) || ((wstatus & 0x7fU) == 0xb)) {
        if (((this->graphics_progress < 0) || (this->compute_progress < 0)) ||
           (this->raytracing_progress < 0)) {
          fprintf(_stderr,
                  "Fossilize ERROR: Child process %d terminated before we could receive progress. Cannot continue.\n"
                  ,(ulong)uVar1);
          fflush(_stderr);
          if (Global::control_block != 0) {
            LOCK();
            *(int *)(Global::control_block + 0x34) = *(int *)(Global::control_block + 0x34) + 1;
            UNLOCK();
          }
          this_local._7_1_ = false;
        }
        else {
          if (Global::control_block != 0) {
            LOCK();
            *(int *)(Global::control_block + 0x30) = *(int *)(Global::control_block + 0x30) + 1;
            UNLOCK();
          }
          this->start_graphics_index = this->graphics_progress;
          this->start_compute_index = this->compute_progress;
          this->start_raytracing_index = this->raytracing_progress;
          if (((this->start_graphics_index < this->end_graphics_index) ||
              (this->start_compute_index < this->end_compute_index)) ||
             (this->start_raytracing_index < this->end_raytracing_index)) {
            fprintf(_stderr,"Fossilize ERROR: Process index %u (PID: %d) crashed, but will retry.\n"
                    ,(ulong)this->index,(ulong)uVar1);
            fflush(_stderr);
            fprintf(_stderr,"Fossilize ERROR:   New graphics range (%u, %u)\n",
                    (ulong)this->start_graphics_index,(ulong)this->end_graphics_index);
            fflush(_stderr);
            fprintf(_stderr,"Fossilize ERROR:   New compute range (%u, %u)\n",
                    (ulong)this->start_compute_index,(ulong)this->end_compute_index);
            fflush(_stderr);
            fprintf(_stderr,"Fossilize ERROR:   New raytracing range (%u, %u)\n",
                    (ulong)this->start_raytracing_index,(ulong)this->end_raytracing_index);
            fflush(_stderr);
            this_local._7_1_ = true;
          }
          else {
            fprintf(_stderr,
                    "Fossilize ERROR: Process index %u (PID: %d) crashed, but there is nothing more to replay.\n"
                    ,(ulong)this->index,(ulong)uVar1);
            fflush(_stderr);
            this_local._7_1_ = false;
          }
        }
      }
      else {
        fprintf(_stderr,
                "Fossilize ERROR: Process index %u (PID: %d) failed to terminate in a clean fashion (signal %d). We cannot continue replaying.\n"
                ,(ulong)this->index,(ulong)uVar1,(ulong)(wstatus & 0x7f));
        fflush(_stderr);
        if (Global::control_block != 0) {
          LOCK();
          *(int *)(Global::control_block + 0x34) = *(int *)(Global::control_block + 0x34) + 1;
          UNLOCK();
        }
        this_local._7_1_ = false;
      }
    }
    else {
      fprintf(_stderr,"Fossilize INFO: Parent process is shutting down. Expected SIGKILL.\n");
      fflush(_stderr);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ProcessProgress::process_shutdown(int wstatus)
{
	// Flush out all messages we got.
	while (process_once());
	parse_buffer.clear();
	heartbeats = -1;

	close_and_remove_epoll_entry(crash_fd);
	// Close the timerfd.
	close_and_remove_epoll_entry(timer_fd);
	close_and_remove_epoll_entry(watchdog_timer_fd);

	// Reap child process.
	Global::active_processes--;
	auto wait_pid = pid;
	pid = -1;

	// If application exited in normal manner, we are done.
	if (WIFEXITED(wstatus) && WEXITSTATUS(wstatus) == 0)
		return false;

	if (WIFSIGNALED(wstatus) && WTERMSIG(wstatus) == SIGKILL && expect_kill)
	{
		LOGI("Parent process is shutting down. Expected SIGKILL.\n");
		return false;
	}

	if (WIFSIGNALED(wstatus) && WTERMSIG(wstatus) == SIGKILL)
	{
		// We had to kill the process early. Log this for debugging.
		LOGE("Process index %u (PID: %d) failed and it had to be killed in timeout with SIGKILL.\n",
		     index, wait_pid);
	}

	// If the child did not exit in a normal manner, we failed to catch any crashing signal.
	// Do not try any further.
	if (!WIFEXITED(wstatus) && WIFSIGNALED(wstatus) &&
	    (WTERMSIG(wstatus) != SIGKILL && WTERMSIG(wstatus) != SIGSEGV))
	{
		LOGE("Process index %u (PID: %d) failed to terminate in a clean fashion (signal %d). We cannot continue replaying.\n",
		     index, wait_pid, WTERMSIG(wstatus));

		if (Global::control_block)
			Global::control_block->dirty_process_deaths.fetch_add(1, std::memory_order_relaxed);
		return false;
	}

	// We might have crashed, but we never saw any progress marker.
	// We do not know what to do from here, so we just terminate.
	if (graphics_progress < 0 || compute_progress < 0 || raytracing_progress < 0)
	{
		LOGE("Child process %d terminated before we could receive progress. Cannot continue.\n",
		     wait_pid);
		if (Global::control_block)
			Global::control_block->dirty_process_deaths.fetch_add(1, std::memory_order_relaxed);
		return false;
	}

	if (Global::control_block)
		Global::control_block->clean_process_deaths.fetch_add(1, std::memory_order_relaxed);

	start_graphics_index = uint32_t(graphics_progress);
	start_compute_index = uint32_t(compute_progress);
	start_raytracing_index = uint32_t(raytracing_progress);
	if (start_graphics_index >= end_graphics_index &&
	    start_compute_index >= end_compute_index &&
	    start_raytracing_index >= end_raytracing_index)
	{
		LOGE("Process index %u (PID: %d) crashed, but there is nothing more to replay.\n", index, wait_pid);
		return false;
	}
	else
	{
		LOGE("Process index %u (PID: %d) crashed, but will retry.\n", index, wait_pid);
		LOGE("  New graphics range (%u, %u)\n", start_graphics_index, end_graphics_index);
		LOGE("  New compute range (%u, %u)\n", start_compute_index, end_compute_index);
		LOGE("  New raytracing range (%u, %u)\n", start_raytracing_index, end_raytracing_index);
		return true;
	}
}